

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O3

QSize __thiscall QtMWidgets::ToolBarLayout::minimumSize(ToolBarLayout *this)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  QSize QVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  
  uVar3 = (**(code **)(*(long *)this->left + 0x10))();
  iVar6 = (int)((ulong)uVar3 >> 0x20);
  if ((this->buttons).d.size == 0) {
    uVar1 = FingerGeometry::width();
    uVar4 = (ulong)uVar1;
    iVar2 = FingerGeometry::height();
  }
  else {
    uVar4 = (**(code **)(*(long *)*(this->buttons).d.ptr + 0x10))();
    iVar2 = (int)(uVar4 >> 0x20);
  }
  auVar9 = QLayout::contentsMargins();
  iVar7 = (int)uVar3;
  iVar8 = (int)uVar4;
  if (this->orient == Horizontal) {
    iVar7 = auVar9._8_4_ + auVar9._0_4_ + (iVar8 + iVar7) * 2;
    if (iVar6 < iVar2) {
      iVar6 = iVar2;
    }
    iVar6 = auVar9._12_4_ + auVar9._4_4_ + iVar6;
  }
  else {
    iVar6 = auVar9._12_4_ + auVar9._4_4_ + (iVar2 + iVar6) * 2;
    if (iVar7 < iVar8) {
      iVar7 = iVar8;
    }
    iVar7 = iVar7 + auVar9._0_4_ + auVar9._8_4_;
  }
  QVar5.ht = iVar6;
  QVar5.wd = iVar7;
  return QVar5;
}

Assistant:

QSize
ToolBarLayout::minimumSize() const
{
	int width = 0;
	int height = 0;

	const QSize arrowSize = left->sizeHint();

	QSize buttonSize;

	if( !buttons.isEmpty() )
		buttonSize = buttons.at( 0 )->sizeHint();
	else
		buttonSize = QSize( FingerGeometry::width(),
			FingerGeometry::height() );

	const QMargins m = contentsMargins();

	if( orient == Qt::Horizontal )
	{
		width = arrowSize.width() * 2 + buttonSize.width() * 2 + m.left() +
			m.right();
		height = qMax( arrowSize.height(), buttonSize.height() ) + m.top() +
			m.bottom();
	}
	else
	{
		height = arrowSize.height() * 2 + buttonSize.height() * 2 + m.top() +
			m.bottom();
		width = qMax( arrowSize.width(), buttonSize.width() ) + m.left() +
			m.right();
	}

	return QSize( width, height );
}